

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfilesystemmodel.cpp
# Opt level: O2

void QFileSystemModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFlagsStorageHelper<QFileSystemModel::Option,_4> *pQVar1;
  undefined1 uVar2;
  bool bVar3;
  QFlagsStorageHelper<QFileSystemModel::Option,_4> QVar4;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      directoryLoaded((QFileSystemModel *)_o,(QString *)_a[1]);
      return;
    }
    if (_id == 1) {
      fileRenamed((QFileSystemModel *)_o,(QString *)_a[1],(QString *)_a[2],(QString *)_a[3]);
      return;
    }
    if (_id == 0) {
      rootPathChanged((QFileSystemModel *)_o,(QString *)_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if ((uint)_id < 4) {
      pQVar1 = (QFlagsStorageHelper<QFileSystemModel::Option,_4> *)*_a;
      switch(_id) {
      case 0:
        uVar2 = resolveSymlinks((QFileSystemModel *)_o);
        break;
      case 1:
        uVar2 = *(undefined1 *)(*(long *)(_o + 8) + 0x1b1);
        break;
      case 2:
        uVar2 = *(undefined1 *)(*(long *)(_o + 8) + 0x1b3);
        break;
      case 3:
        QVar4.super_QFlagsStorage<QFileSystemModel::Option>.i =
             (QFlagsStorage<QFileSystemModel::Option>)options((QFileSystemModel *)_o);
        pQVar1->super_QFlagsStorage<QFileSystemModel::Option> =
             QVar4.super_QFlagsStorage<QFileSystemModel::Option>.i;
        return;
      }
      *(undefined1 *)&pQVar1->super_QFlagsStorage<QFileSystemModel::Option> = uVar2;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      pQVar1 = (QFlagsStorageHelper<QFileSystemModel::Option,_4> *)*_a;
      switch(_id) {
      case 0:
        setResolveSymlinks((QFileSystemModel *)_o,
                           *(bool *)&pQVar1->super_QFlagsStorage<QFileSystemModel::Option>);
        return;
      case 1:
        *(undefined1 *)(*(long *)(_o + 8) + 0x1b1) =
             *(undefined1 *)&pQVar1->super_QFlagsStorage<QFileSystemModel::Option>;
        break;
      case 2:
        setNameFilterDisables
                  ((QFileSystemModel *)_o,
                   *(bool *)&pQVar1->super_QFlagsStorage<QFileSystemModel::Option>);
        return;
      case 3:
        setOptions((QFileSystemModel *)_o,
                   (QFlagsStorageHelper<QFileSystemModel::Option,_4>)
                   pQVar1->super_QFlagsStorage<QFileSystemModel::Option>);
        return;
      }
    }
    break;
  case IndexOfMethod:
    bVar3 = QtMocHelpers::indexOfMethod<void(QFileSystemModel::*)(QString_const&)>
                      ((QtMocHelpers *)_a,(void **)rootPathChanged,0,0);
    if ((!bVar3) &&
       (bVar3 = QtMocHelpers::
                indexOfMethod<void(QFileSystemModel::*)(QString_const&,QString_const&,QString_const&)>
                          ((QtMocHelpers *)_a,(void **)fileRenamed,0,1), !bVar3)) {
      QtMocHelpers::indexOfMethod<void(QFileSystemModel::*)(QString_const&)>
                ((QtMocHelpers *)_a,(void **)directoryLoaded,0,2);
      return;
    }
  }
  return;
}

Assistant:

void QFileSystemModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFileSystemModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->rootPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->fileRenamed((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 2: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFileSystemModel::*)(const QString & )>(_a, &QFileSystemModel::rootPathChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileSystemModel::*)(const QString & , const QString & , const QString & )>(_a, &QFileSystemModel::fileRenamed, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileSystemModel::*)(const QString & )>(_a, &QFileSystemModel::directoryLoaded, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->resolveSymlinks(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->nameFilterDisables(); break;
        case 3: *reinterpret_cast<Options*>(_v) = _t->options(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setResolveSymlinks(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setNameFilterDisables(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setOptions(*reinterpret_cast<Options*>(_v)); break;
        default: break;
        }
    }
}